

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

void canvas_key(_glist *x,t_symbol *s,int ac,t_atom *av)

{
  char cVar1;
  int iVar2;
  t_symbol *keysym;
  t_symbol *ptVar3;
  void *pvVar4;
  uint dy;
  t_editor *ptVar5;
  uint dx;
  char *pcVar6;
  int in_R9D;
  _rtext *x_00;
  uint keynum;
  t_float tVar7;
  t_float tVar8;
  char buf [5];
  t_atom local_58;
  undefined4 local_48;
  t_symbol *local_40;
  
  if (ac < 3) {
    return;
  }
  *(undefined4 *)((pd_maininstance.pd_gui)->i_editor + 0x40) = 0;
  tVar7 = atom_getfloat(av);
  tVar8 = atom_getfloat(av + 2);
  if (av[1].a_type != A_FLOAT) {
    if (av[1].a_type != A_SYMBOL) {
      pcVar6 = "?";
      goto LAB_0014110c;
    }
    ptVar3 = av[1].a_w.w_symbol;
    keysym = ptVar3;
LAB_0014112f:
    iVar2 = strcmp(ptVar3->s_name,"Return");
    keynum = 10;
    if (iVar2 != 0) {
      keynum = 0;
    }
    goto switchD_0014117c_caseD_f710;
  }
  iVar2 = (int)av[1].a_w.w_float;
  if (iVar2 < 0x1b) {
    if (iVar2 == 8) {
      pcVar6 = "BackSpace";
    }
    else if (iVar2 == 9) {
      pcVar6 = "Tab";
    }
    else if (iVar2 == 10) {
      pcVar6 = "Return";
    }
    else {
LAB_001411e2:
      pcVar6 = (char *)&local_58;
      u8_wc_toutf8_nul(pcVar6,(uint32_t)(long)av[1].a_w.w_float);
    }
  }
  else if (iVar2 == 0x1b) {
    pcVar6 = "Escape";
  }
  else if (iVar2 == 0x20) {
    pcVar6 = "Space";
  }
  else {
    if (iVar2 != 0x7f) goto LAB_001411e2;
    pcVar6 = "Delete";
  }
LAB_0014110c:
  keysym = gensym(pcVar6);
  keynum = 0;
  if (av[1].a_type != A_FLOAT) {
    if (av[1].a_type != A_SYMBOL) goto switchD_0014117c_caseD_f710;
    ptVar3 = av[1].a_w.w_symbol;
    goto LAB_0014112f;
  }
  keynum = (uint)av[1].a_w.w_float;
  if ((int)keynum < 0x7d) {
    switch(keynum) {
    case 0x1c:
      goto switchD_0014117c_caseD_f702;
    case 0x1d:
      goto switchD_0014117c_caseD_f703;
    case 0x1e:
      goto switchD_0014117c_caseD_f700;
    case 0x1f:
      goto switchD_0014117c_caseD_f701;
    default:
      if (keynum == 0xd) {
        keynum = 10;
      }
      else if (keynum == 0x7b) goto LAB_00141253;
    }
    goto switchD_0014117c_caseD_f710;
  }
  switch(keynum) {
  case 0xf700:
switchD_0014117c_caseD_f700:
    pcVar6 = "Up";
    break;
  case 0xf701:
switchD_0014117c_caseD_f701:
    pcVar6 = "Down";
    break;
  case 0xf702:
switchD_0014117c_caseD_f702:
    pcVar6 = "Left";
    break;
  case 0xf703:
switchD_0014117c_caseD_f703:
    pcVar6 = "Right";
    break;
  case 0xf704:
    pcVar6 = "F1";
    break;
  case 0xf705:
    pcVar6 = "F2";
    break;
  case 0xf706:
    pcVar6 = "F3";
    break;
  case 0xf707:
    pcVar6 = "F4";
    break;
  case 0xf708:
    pcVar6 = "F5";
    break;
  case 0xf709:
    pcVar6 = "F6";
    break;
  case 0xf70a:
    pcVar6 = "F7";
    break;
  case 0xf70b:
    pcVar6 = "F8";
    break;
  case 0xf70c:
    pcVar6 = "F9";
    break;
  case 0xf70d:
    pcVar6 = "F10";
    break;
  case 0xf70e:
    pcVar6 = "F11";
    break;
  case 0xf70f:
    pcVar6 = "F12";
    break;
  case 0xf710:
  case 0xf711:
  case 0xf712:
  case 0xf713:
  case 0xf714:
  case 0xf715:
  case 0xf716:
  case 0xf717:
  case 0xf718:
  case 0xf719:
  case 0xf71a:
  case 0xf71b:
  case 0xf71c:
  case 0xf71d:
  case 0xf71e:
  case 0xf71f:
  case 0xf720:
  case 0xf721:
  case 0xf722:
  case 0xf723:
  case 0xf724:
  case 0xf725:
  case 0xf726:
  case 0xf727:
  case 0xf728:
  case 0xf72a:
    goto switchD_0014117c_caseD_f710;
  case 0xf729:
    pcVar6 = "Home";
    break;
  case 0xf72b:
    pcVar6 = "End";
    break;
  case 0xf72c:
    pcVar6 = "Prior";
    break;
  case 0xf72d:
    pcVar6 = "Next";
    break;
  default:
    if (keynum == 0x7d) {
LAB_00141253:
      post("keycode %d: dropped",(ulong)keynum);
      return;
    }
    goto switchD_0014117c_caseD_f710;
  }
  keysym = gensym(pcVar6);
  keynum = 0;
switchD_0014117c_caseD_f710:
  ptVar3 = gensym("#key");
  if ((ptVar3->s_thing != (_class **)0x0) && ((tVar7 != 0.0 || (NAN(tVar7))))) {
    ptVar3 = gensym("#key");
    pd_float(ptVar3->s_thing,(float)(int)keynum);
  }
  ptVar3 = gensym("#keyup");
  if (((ptVar3->s_thing != (_class **)0x0) && (tVar7 == 0.0)) && (!NAN(tVar7))) {
    ptVar3 = gensym("#keyup");
    pd_float(ptVar3->s_thing,(float)(int)keynum);
  }
  ptVar3 = gensym("#keyname");
  if (ptVar3->s_thing != (_class **)0x0) {
    local_58._4_4_ = SUB84((ulong)*(undefined8 *)av >> 0x20,0);
    local_58.a_type = A_FLOAT;
    local_58.a_w._4_4_ = SUB84(av->a_w,4);
    local_58.a_w.w_symbol =
         (t_symbol *)(CONCAT44(local_58.a_w._4_4_,-(uint)(tVar7 != 0.0)) & 0xffffffff3f800000);
    local_48 = 2;
    local_40 = keysym;
    ptVar3 = gensym("#keyname");
    pd_list(ptVar3->s_thing,(t_symbol *)0x0,2,&local_58);
  }
  if (x == (_glist *)0x0) {
    return;
  }
  ptVar5 = x->gl_editor;
  if (ptVar5 == (t_editor *)0x0) {
    return;
  }
  if ((tVar7 == 0.0) && (!NAN(tVar7))) goto LAB_00141783;
  if ((ptVar5->field_0x88 & 7) == 1) {
    ptVar5->field_0x88 = ptVar5->field_0x88 & 0xf8;
    ptVar5 = x->gl_editor;
  }
  if (((ptVar5->e_grab != (t_gobj *)0x0) && (keynum != 0)) && (ptVar5->e_keyfn != (t_glistkeyfn)0x0)
     ) {
    (*ptVar5->e_keyfn)(ptVar5->e_grab,keysym,(float)(int)keynum);
    goto LAB_00141783;
  }
  x_00 = ptVar5->e_textedfor;
  if (x_00 != (_rtext *)0x0) {
    if (keynum == 0) {
      pcVar6 = keysym->s_name;
      iVar2 = strcmp(pcVar6,"Home");
      if (((iVar2 != 0) && (iVar2 = strcmp(pcVar6,"End"), iVar2 != 0)) &&
         ((((cVar1 = *pcVar6, cVar1 != 'U' || ((pcVar6[1] != 'p' || (pcVar6[2] != '\0')))) &&
           (iVar2 = strcmp(pcVar6,"Down"), iVar2 != 0)) &&
          ((iVar2 = strcmp(pcVar6,"Left"), iVar2 != 0 &&
           (iVar2 = strcmp(pcVar6,"Right"), iVar2 != 0)))))) goto LAB_0014162e;
    }
    if ((ptVar5->field_0x88 & 0x10) == 0) {
      pvVar4 = canvas_undo_set_cut(x,3);
      canvas_setundo(x,canvas_undo_cut,pvVar4,"typing");
      x_00 = x->gl_editor->e_textedfor;
    }
    rtext_key(x_00,keynum,keysym);
    if ((x->gl_editor->field_0x88 & 0x10) != 0) {
      canvas_dirty(x,1.0);
    }
    goto LAB_00141783;
  }
  if ((keynum == 8) || (keynum == 0x7f)) {
    if (ptVar5->e_selection != (t_selection *)0x0) {
      canvas_undo_add(x,UNDO_SEQUENCE_START,"clear",(void *)0x0);
      ptVar5 = x->gl_editor;
    }
    if ((ptVar5->field_0x88 & 0x20) != 0) {
      canvas_clearline(x);
      ptVar5 = x->gl_editor;
    }
    if (ptVar5->e_selection == (t_selection *)0x0) {
      return;
    }
    pvVar4 = canvas_undo_set_cut(x,2);
    canvas_undo_add(x,UNDO_CUT,"clear",pvVar4);
    canvas_doclear(x);
    canvas_undo_add(x,UNDO_SEQUENCE_END,"clear",(void *)0x0);
    return;
  }
  pcVar6 = keysym->s_name;
  cVar1 = *pcVar6;
LAB_0014162e:
  if ((cVar1 == 'U') && ((pcVar6[1] == 'p' && (pcVar6[2] == '\0')))) {
    dy = -(uint)(tVar8 == 0.0) | 0xfffffff6;
LAB_00141779:
    dx = 0;
  }
  else {
    iVar2 = strcmp(pcVar6,"Down");
    if (iVar2 == 0) {
      dy = (-(uint)(tVar8 != 0.0) & 1) * 9 + 1;
      goto LAB_00141779;
    }
    iVar2 = strcmp(pcVar6,"Left");
    if (iVar2 == 0) {
      dx = -(uint)(tVar8 == 0.0) | 0xfffffff6;
    }
    else {
      iVar2 = strcmp(pcVar6,"Right");
      if (iVar2 != 0) {
        if ((((ptVar5->field_0x88 & 7) == 2) &&
            (*(int *)((pd_maininstance.pd_gui)->i_editor + 0x90) == 5)) &&
           (iVar2 = strncmp(pcVar6,"Shift",5), iVar2 == 0)) {
          canvas_doconnect(x,ptVar5->e_xnew,ptVar5->e_ynew,1,1);
          canvas_doclick(x,x->gl_editor->e_xwas,x->gl_editor->e_ywas,0,1,in_R9D);
        }
        goto LAB_00141783;
      }
      dx = (-(uint)(tVar8 != 0.0) & 1) * 9 + 1;
    }
    dy = 0;
  }
  canvas_displaceselection(x,dx,dy);
LAB_00141783:
  if (((keynum == 0) && ((x->field_0xe8 & 0x20) != 0)) &&
     (iVar2 = strncmp(keysym->s_name,"Control",7), iVar2 == 0)) {
    canvas_setcursor(x,(-(uint)(tVar7 == 0.0) & 1) << 2);
  }
  return;
}

Assistant:

void canvas_key(t_canvas *x, t_symbol *s, int ac, t_atom *av)
{
    int keynum, fflag;
    t_symbol *gotkeysym;

    int down, shift;

    if (ac < 3)
        return;

    EDITOR->canvas_undo_already_set_move = 0;
    down = (atom_getfloat(av) != 0);  /* nonzero if it's a key down */
    shift = (atom_getfloat(av+2) != 0);  /* nonzero if shift-ed */
    if (av[1].a_type == A_SYMBOL)
        gotkeysym = av[1].a_w.w_symbol;
    else if (av[1].a_type == A_FLOAT)
    {
        char buf[UTF8_MAXBYTES1];
        switch((int)(av[1].a_w.w_float))
        {
        case 8:  gotkeysym = gensym("BackSpace"); break;
        case 9:  gotkeysym = gensym("Tab"); break;
        case 10: gotkeysym = gensym("Return"); break;
        case 27: gotkeysym = gensym("Escape"); break;
        case 32: gotkeysym = gensym("Space"); break;
        case 127:gotkeysym = gensym("Delete"); break;
        default:
                /*-- moo: assume keynum is a Unicode codepoint; encode as UTF-8 --*/
            u8_wc_toutf8_nul(buf, (UCS4)(av[1].a_w.w_float));
            gotkeysym = gensym(buf);
        }
    }
    else gotkeysym = gensym("?");
    fflag = (av[0].a_type == A_FLOAT ? av[0].a_w.w_float : 0);
    keynum = (av[1].a_type == A_FLOAT ? av[1].a_w.w_float : 0);
    if (keynum == '{' || keynum == '}')
    {
        post("keycode %d: dropped", (int)keynum);
        return;
    }
#if 0
    post("keynum %d, down %d", (int)keynum, down);
#endif
    if (keynum == '\r') keynum = '\n';
    if (av[1].a_type == A_SYMBOL &&
        !strcmp(av[1].a_w.w_symbol->s_name, "Return"))
            keynum = '\n';
        /* alias Apple key numbers to symbols.  This is done unconditionally,
           not just if we're on an Apple, just in case the GUI is remote. */
    if (keynum == 30 || keynum == 63232)
        keynum = 0, gotkeysym = gensym("Up");
    else if (keynum == 31 || keynum == 63233)
        keynum = 0, gotkeysym = gensym("Down");
    else if (keynum == 28 || keynum == 63234)
        keynum = 0, gotkeysym = gensym("Left");
    else if (keynum == 29 || keynum == 63235)
        keynum = 0, gotkeysym = gensym("Right");
    else if (keynum == 63273)
        keynum = 0, gotkeysym = gensym("Home");
    else if (keynum == 63275)
        keynum = 0, gotkeysym = gensym("End");
    else if (keynum == 63276)
        keynum = 0, gotkeysym = gensym("Prior");
    else if (keynum == 63277)
        keynum = 0, gotkeysym = gensym("Next");
    else if (keynum == 63236)
        keynum = 0, gotkeysym = gensym("F1");
    else if (keynum == 63237)
        keynum = 0, gotkeysym = gensym("F2");
    else if (keynum == 63238)
        keynum = 0, gotkeysym = gensym("F3");
    else if (keynum == 63239)
        keynum = 0, gotkeysym = gensym("F4");
    else if (keynum == 63240)
        keynum = 0, gotkeysym = gensym("F5");
    else if (keynum == 63241)
        keynum = 0, gotkeysym = gensym("F6");
    else if (keynum == 63242)
        keynum = 0, gotkeysym = gensym("F7");
    else if (keynum == 63243)
        keynum = 0, gotkeysym = gensym("F8");
    else if (keynum == 63244)
        keynum = 0, gotkeysym = gensym("F9");
    else if (keynum == 63245)
        keynum = 0, gotkeysym = gensym("F10");
    else if (keynum == 63246)
        keynum = 0, gotkeysym = gensym("F11");
    else if (keynum == 63247)
        keynum = 0, gotkeysym = gensym("F12");
    if (gensym("#key")->s_thing && down)
        pd_float(gensym("#key")->s_thing, (t_float)keynum);
    if (gensym("#keyup")->s_thing && !down)
        pd_float(gensym("#keyup")->s_thing, (t_float)keynum);
    if (gensym("#keyname")->s_thing)
    {
        t_atom at[2];
        at[0] = av[0];
        SETFLOAT(at, down);
        SETSYMBOL(at+1, gotkeysym);
        pd_list(gensym("#keyname")->s_thing, 0, 2, at);
    }
    if (!x || !x->gl_editor)  /* if that 'invis'ed the window,  stop. */
        return;
    if (x && down)
    {
            /* cancel any dragging action */
        if (x->gl_editor->e_onmotion == MA_MOVE)
            x->gl_editor->e_onmotion = MA_NONE;
            /* if an object has "grabbed" keys just send them on */
        if (x->gl_editor->e_grab
            && x->gl_editor->e_keyfn && keynum)
                (* x->gl_editor->e_keyfn)
                    (x->gl_editor->e_grab, gotkeysym, (t_float)keynum);
            /* if a text editor is open send the key on, as long as
               it is either "real" (has a key number) or else is an arrow key. */
        else if (x->gl_editor->e_textedfor && (keynum
            || !strcmp(gotkeysym->s_name, "Home")
            || !strcmp(gotkeysym->s_name, "End")
            || !strcmp(gotkeysym->s_name, "Up")
            || !strcmp(gotkeysym->s_name, "Down")
            || !strcmp(gotkeysym->s_name, "Left")
            || !strcmp(gotkeysym->s_name, "Right")))
        {
                /* send the key to the box's editor */
            if (!x->gl_editor->e_textdirty)
            {
                canvas_setundo(x, canvas_undo_cut,
                    canvas_undo_set_cut(x, UCUT_TEXT), "typing");
            }
            rtext_key(x->gl_editor->e_textedfor,
                (int)keynum, gotkeysym);
            if (x->gl_editor->e_textdirty)
                canvas_dirty(x, 1);
        }
            /* check for backspace or clear */
        else if (keynum == 8 || keynum == 127)
        {
            if (x->gl_editor->e_selection)
                canvas_undo_add(x, UNDO_SEQUENCE_START, "clear", 0);
            if (x->gl_editor->e_selectedline)
                canvas_clearline(x);
            if (x->gl_editor->e_selection)
            {
                canvas_undo_add(x, UNDO_CUT, "clear",
                    canvas_undo_set_cut(x, UCUT_CLEAR));
                canvas_doclear(x);
                canvas_undo_add(x, UNDO_SEQUENCE_END, "clear", 0);
            }
        }
            /* check for arrow keys */
        else if (!strcmp(gotkeysym->s_name, "Up"))
            canvas_displaceselection(x, 0, shift ? -10 : -1);
        else if (!strcmp(gotkeysym->s_name, "Down"))
            canvas_displaceselection(x, 0, shift ? 10 : 1);
        else if (!strcmp(gotkeysym->s_name, "Left"))
            canvas_displaceselection(x, shift ? -10 : -1, 0);
        else if (!strcmp(gotkeysym->s_name, "Right"))
            canvas_displaceselection(x, shift ? 10 : 1, 0);
        else if ((MA_CONNECT == x->gl_editor->e_onmotion)
            && (CURSOR_EDITMODE_CONNECT == EDITOR->canvas_cursorwas)
                 && !strncmp(gotkeysym->s_name, "Shift", 5))
        {
                /* <Shift> while in connect-mode: create connection... */
            canvas_doconnect(x, x->gl_editor->e_xnew, x->gl_editor->e_ynew, 1, 1);
                /* ... and continue in connect-mode */
            canvas_doclick(x, x->gl_editor->e_xwas, x->gl_editor->e_ywas, 0, 0, 1);

        }
    }
        /* if control key goes up or down, and if we're in edit mode, change
           cursor to indicate how the click action changes */
    if (x && keynum == 0 && x->gl_edit &&
        !strncmp(gotkeysym->s_name, "Control", 7))
            canvas_setcursor(x, down ?
                CURSOR_RUNMODE_NOTHING :CURSOR_EDITMODE_NOTHING);
}